

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

bool __thiscall
runtime::VirtualMachine::variableEquals(VirtualMachine *this,Variable var1,Variable var2)

{
  size_t __n;
  int iVar1;
  anon_union_8_6_52c89740_for_Variable_1 aVar2;
  anon_union_8_6_52c89740_for_Variable_1 aVar3;
  bool bVar4;
  string local_40;
  
  aVar3 = var2.field_1;
  aVar2 = var1.field_1;
  if (var1.type == var2.type) {
    bVar4 = true;
    switch(var1._0_8_ & 0xffffffff) {
    case 0:
      break;
    case 1:
    case 5:
    case 6:
      bVar4 = aVar2.integerValue == aVar3.integerValue;
      break;
    case 2:
      bVar4 = ((var2.field_1._0_4_ ^ var1.field_1._0_4_) & 1) == 0;
      break;
    case 3:
      bVar4 = (bool)(-(aVar3.doubleValue == aVar2.doubleValue) & 1);
      break;
    case 4:
      __n = (aVar2.stringValue)->_M_string_length;
      if (__n == ((aVar3.objectValue)->properties)._M_h._M_bucket_count) {
        if (__n == 0) {
          return true;
        }
        iVar1 = bcmp(((aVar2.objectValue)->properties)._M_h._M_buckets,
                     ((aVar3.objectValue)->properties)._M_h._M_buckets,__n);
        return iVar1 == 0;
      }
      goto LAB_00117d1b;
    default:
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unknown varible type at variableEquals","");
      panic(this,&local_40);
    }
  }
  else {
LAB_00117d1b:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool VirtualMachine::variableEquals(Variable var1, Variable var2) {
  if (var1.type != var2.type) {
    return false;
  }

  switch (var1.type) {
    case VariableType::Integer: {
      return var1.integerValue == var2.integerValue;
    }
    case VariableType::Float: {
      return var1.doubleValue == var2.doubleValue;
    }
    case VariableType::Function: {
      return var1.functionValue == var2.functionValue;
    }
    case VariableType::Object: {
      return var1.objectValue == var2.objectValue;
    }
    case VariableType::String: {
      return *var1.stringValue == *var2.stringValue;
    }
    case VariableType::Undefined: {
      return true;
    }
    case VariableType::Boolean: {
      return var1.boolValue == var2.boolValue;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }
}